

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_image_color(nk_context *ctx,nk_image img,nk_color col)

{
  nk_rect r;
  nk_widget_layout_states nVar1;
  undefined4 in_ESI;
  long in_RDI;
  nk_context *unaff_retaddr;
  nk_rect *in_stack_00000008;
  nk_rect bounds;
  nk_window *win;
  nk_image *in_stack_ffffffffffffffe0;
  nk_command_buffer *b;
  undefined4 in_stack_fffffffffffffff8;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) {
    b = *(nk_command_buffer **)(in_RDI + 0x40d8);
    nVar1 = nk_widget(in_stack_00000008,unaff_retaddr);
    if (nVar1 != NK_WIDGET_INVALID) {
      r.y = (float)in_ESI;
      r.x = (float)in_stack_fffffffffffffff8;
      r._8_8_ = unaff_retaddr;
      nk_draw_image(b,r,in_stack_ffffffffffffffe0,SUB84((ulong)in_RDI >> 0x20,0));
    }
  }
  return;
}

Assistant:

NK_API void
nk_image_color(struct nk_context *ctx, struct nk_image img, struct nk_color col)
{
struct nk_window *win;
struct nk_rect bounds;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return;

win = ctx->current;
if (!nk_widget(&bounds, ctx)) return;
nk_draw_image(&win->buffer, bounds, &img, col);
}